

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O1

string * __thiscall
absl::lts_20250127::CEscape_abi_cxx11_
          (string *__return_storage_ptr__,lts_20250127 *this,string_view src)

{
  lts_20250127 *plVar1;
  byte bVar2;
  lts_20250127 *plVar3;
  pointer pcVar4;
  ulong uVar5;
  lts_20250127 *plVar6;
  lts_20250127 *plVar7;
  bool bVar8;
  string death_message;
  long *local_68 [2];
  long local_58 [2];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  uVar5 = src._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  plVar3 = (lts_20250127 *)0x3fffffffffffffff;
  if (this < (lts_20250127 *)0x3fffffffffffffff) {
    plVar3 = this;
  }
  if (this == (lts_20250127 *)0x0) {
    plVar3 = (lts_20250127 *)0x0;
    plVar7 = (lts_20250127 *)0x0;
  }
  else {
    plVar7 = (lts_20250127 *)0x0;
    plVar6 = (lts_20250127 *)0x0;
    do {
      plVar1 = plVar6 + uVar5;
      plVar6 = plVar6 + 1;
      plVar7 = plVar7 + (byte)(anonymous_namespace)::kCEscapedLen[(byte)*plVar1];
    } while (plVar3 != plVar6);
  }
  if (plVar3 < this) {
    do {
      bVar8 = CARRY8((ulong)(byte)(anonymous_namespace)::kCEscapedLen[(byte)plVar3[uVar5]],
                     (ulong)plVar7);
      plVar7 = plVar7 + (byte)(anonymous_namespace)::kCEscapedLen[(byte)plVar3[uVar5]];
      if (bVar8) {
        local_48[0] = local_38;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_48,
                   "Check escaped_len <= std::numeric_limits<size_t>::max() - char_len failed: ","")
        ;
        local_68[0] = local_58;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_68,"escaped_len overflow","");
        std::__cxx11::string::_M_append((char *)local_48,(ulong)local_68[0]);
        if (local_68[0] != local_58) {
          operator_delete(local_68[0],local_58[0] + 1);
        }
        (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                  (3,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/escaping.cc"
                   ,0x1be,local_48);
        __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/escaping.cc"
                      ,0x1be,
                      "size_t absl::lts_20250127::(anonymous namespace)::CEscapedLength(absl::string_view)"
                     );
      }
      plVar3 = plVar3 + 1;
    } while (this != plVar3);
  }
  if (plVar7 == this) {
    std::__cxx11::string::append((char *)__return_storage_ptr__,uVar5);
  }
  else {
    if (plVar7 + 3 == (lts_20250127 *)0x0) {
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,"Check new_dest_len > cur_dest_len failed: ","");
      local_68[0] = local_58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_68,"std::string size overflow","");
      std::__cxx11::string::_M_append((char *)local_48,(ulong)local_68[0]);
      if (local_68[0] != local_58) {
        operator_delete(local_68[0],local_58[0] + 1);
      }
      (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                (3,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/escaping.cc"
                 ,0x1d1,local_48);
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/escaping.cc"
                    ,0x1d1,
                    "void absl::lts_20250127::(anonymous namespace)::CEscapeAndAppendInternal(absl::string_view, absl::Nonnull<std::string *>)"
                   );
    }
    std::__cxx11::string::_M_replace_aux((ulong)__return_storage_ptr__,0,0,(char)(plVar7 + 3));
    if (this != (lts_20250127 *)0x0) {
      pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
      plVar3 = (lts_20250127 *)0x0;
      do {
        bVar2 = (anonymous_namespace)::kCEscapedLen[(byte)plVar3[uVar5]];
        *(undefined4 *)pcVar4 =
             *(undefined4 *)
              ("\\000\\001\\002\\003\\004\\005\\006\\007\\010\\t" + (ulong)(byte)plVar3[uVar5] * 4);
        pcVar4 = pcVar4 + bVar2;
        plVar3 = plVar3 + 1;
      } while (this != plVar3);
    }
    std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)plVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CEscape(absl::string_view src) {
  std::string dest;
  CEscapeAndAppendInternal(src, &dest);
  return dest;
}